

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<float,_10> * __thiscall
TPZManVector<float,_10>::operator=(TPZManVector<float,_10> *this,TPZManVector<float,_10> *rval)

{
  long lVar1;
  float *pfVar2;
  uint uVar3;
  long lVar4;
  float *pfVar5;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<float>).fNElements;
    pfVar2 = (this->super_TPZVec<float>).fStore;
    pfVar5 = this->fExtAlloc;
    if (pfVar2 != pfVar5 && pfVar2 != (float *)0x0) {
      operator_delete__(pfVar2);
      (this->super_TPZVec<float>).fStore = (float *)0x0;
      (this->super_TPZVec<float>).fNAlloc = 0;
    }
    if (lVar1 < 0xb) {
      if (lVar1 < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        do {
          pfVar5[lVar4] = rval->fExtAlloc[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        uVar3 = (uint)lVar1;
      }
      if (uVar3 < 10) {
        memset(this->fExtAlloc + uVar3,0,(ulong)(9 - uVar3) * 4 + 4);
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
      }
    }
    else {
      pfVar5 = (rval->super_TPZVec<float>).fStore;
      lVar4 = lVar1;
    }
    (this->super_TPZVec<float>).fStore = pfVar5;
    (this->super_TPZVec<float>).fNAlloc = lVar4;
    (this->super_TPZVec<float>).fNElements = lVar1;
  }
  (rval->super_TPZVec<float>).fStore = (float *)0x0;
  (rval->super_TPZVec<float>).fNElements = 0;
  (rval->super_TPZVec<float>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}